

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_setup_connection(connectdata *conn)

{
  undefined1 *puVar1;
  Curl_easy *pCVar2;
  char *string;
  char cVar3;
  _Bool _Var4;
  undefined8 *puVar5;
  ulong uVar6;
  CURLcode CVar7;
  char *pcVar8;
  
  pCVar2 = conn->data;
  puVar5 = (undefined8 *)(*Curl_ccalloc)(0x30,1);
  (conn->data->req).protop = puVar5;
  if (puVar5 == (undefined8 *)0x0) {
    CVar7 = CURLE_OUT_OF_MEMORY;
  }
  else {
    pcVar8 = (pCVar2->state).up.path + 1;
    puVar5[2] = pcVar8;
    pcVar8 = strstr(pcVar8,";type=");
    if (pcVar8 == (char *)0x0) {
      pcVar8 = strstr((conn->host).rawalloc,";type=");
    }
    if (pcVar8 != (char *)0x0) {
      *pcVar8 = '\0';
      cVar3 = Curl_raw_toupper(pcVar8[6]);
      puVar1 = &(conn->bits).field_0x7;
      *puVar1 = *puVar1 | 2;
      uVar6 = *(ulong *)&(pCVar2->set).field_0x878;
      if (cVar3 == 'D') {
        uVar6 = uVar6 | 0x2000;
      }
      else if (cVar3 == 'A') {
        uVar6 = uVar6 | 0x800;
      }
      else {
        uVar6 = uVar6 & 0xfffffffffffff7ff;
      }
      *(ulong *)&(pCVar2->set).field_0x878 = uVar6;
    }
    *(undefined4 *)(puVar5 + 4) = 0;
    puVar5[5] = 0;
    pcVar8 = conn->user;
    *puVar5 = pcVar8;
    string = conn->passwd;
    puVar5[1] = string;
    _Var4 = isBadFtpString(pcVar8);
    CVar7 = CURLE_URL_MALFORMAT;
    if (!_Var4) {
      _Var4 = isBadFtpString(string);
      if (!_Var4) {
        (conn->proto).ftpc.known_filesize = -1;
        CVar7 = CURLE_OK;
      }
    }
  }
  return CVar7;
}

Assistant:

static CURLcode ftp_setup_connection(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  char *type;
  struct FTP *ftp;

  conn->data->req.protop = ftp = calloc(sizeof(struct FTP), 1);
  if(NULL == ftp)
    return CURLE_OUT_OF_MEMORY;

  ftp->path = &data->state.up.path[1]; /* don't include the initial slash */

  /* FTP URLs support an extension like ";type=<typecode>" that
   * we'll try to get now! */
  type = strstr(ftp->path, ";type=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";type=");

  if(type) {
    char command;
    *type = 0;                     /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);
    conn->bits.type_set = TRUE;

    switch(command) {
    case 'A': /* ASCII mode */
      data->set.prefer_ascii = TRUE;
      break;

    case 'D': /* directory mode */
      data->set.ftp_list_only = TRUE;
      break;

    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->set.prefer_ascii = FALSE;
      break;
    }
  }

  /* get some initial data into the ftp struct */
  ftp->transfer = FTPTRANSFER_BODY;
  ftp->downloadsize = 0;

  /* No need to duplicate user+password, the connectdata struct won't change
     during a session, but we re-init them here since on subsequent inits
     since the conn struct may have changed or been replaced.
  */
  ftp->user = conn->user;
  ftp->passwd = conn->passwd;
  if(isBadFtpString(ftp->user))
    return CURLE_URL_MALFORMAT;
  if(isBadFtpString(ftp->passwd))
    return CURLE_URL_MALFORMAT;

  conn->proto.ftpc.known_filesize = -1; /* unknown size for now */

  return CURLE_OK;
}